

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *
slang::syntax::deepClone<slang::syntax::PackageImportItemSyntax>
          (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *node,BumpAllocator *alloc)

{
  SyntaxNode *pSVar1;
  undefined4 extraout_var;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *pSVar2;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX_02;
  long lVar3;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *args;
  ConstTokenOrSyntax *ele;
  pointer this;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_a0;
  undefined1 local_90;
  Token local_88;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_78;
  
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
            (&local_78,(node->elements)._M_extent._M_extent_value + 1 >> 1);
  this = (node->elements)._M_ptr;
  src = extraout_RDX;
  for (lVar3 = (node->elements)._M_extent._M_extent_value * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18)
  {
    if (*(__index_type *)
         ((long)&(this->super_ConstTokenOrSyntax).
                 super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
         0x10) == '\0') {
      local_88 = ConstTokenOrSyntax::token(&this->super_ConstTokenOrSyntax);
      local_a0._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)parsing::Token::deepClone(&local_88,alloc);
      local_90 = 0;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_a0._M_first);
      src = extraout_RDX_01;
    }
    else {
      pSVar1 = ConstTokenOrSyntax::node(&this->super_ConstTokenOrSyntax);
      pSVar1 = deepClone(pSVar1,alloc);
      local_a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar1;
      local_90 = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_a0._M_first);
      src = extraout_RDX_00;
    }
    this = this + 1;
  }
  local_a0._0_4_ =
       SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                 (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                  (EVP_PKEY_CTX *)alloc,src);
  local_a0._M_first._M_storage.rawLen = extraout_var;
  args = &local_a0;
  local_a0._M_first._M_storage.info = (Info *)extraout_RDX_02;
  pSVar2 = BumpAllocator::
           emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                     (alloc,(span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                            &args->_M_first);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&args->_M_first);
  return pSVar2;
}

Assistant:

SeparatedSyntaxList<T>* deepClone(const SeparatedSyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<TokenOrSyntax> buffer(node.size(), UninitializedTag());
    for (const auto& ele : node.elems()) {
        if (ele.isToken())
            buffer.push_back(ele.token().deepClone(alloc));
        else
            buffer.push_back(static_cast<T*>(deepClone(*ele.node(), alloc)));
    }
    return alloc.emplace<SeparatedSyntaxList<T>>(buffer.copy(alloc));
}